

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O0

jlong Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1nthread_1get
                (JNIEnv *jenv,jclass jcls,jlong jarg1,jobject jarg1_)

{
  undefined4 uVar1;
  undefined4 *puVar2;
  long in_RDX;
  uint32_t result;
  opt_s *arg1;
  jlong jresult;
  
  uVar1 = *(undefined4 *)(in_RDX + 0x5c);
  puVar2 = (undefined4 *)operator_new(4);
  *puVar2 = uVar1;
  return (jlong)puVar2;
}

Assistant:

SWIGEXPORT jlong JNICALL Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1nthread_1get(JNIEnv *jenv, jclass jcls, jlong jarg1, jobject jarg1_) {
  jlong jresult = 0 ;
  opt_s *arg1 = (opt_s *) 0 ;
  uint32_t result;
  
  (void)jenv;
  (void)jcls;
  (void)jarg1_;
  arg1 = *(opt_s **)&jarg1; 
  result =  ((arg1)->nthread);
  *(uint32_t **)&jresult = new uint32_t((const uint32_t &)result); 
  return jresult;
}